

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::TreeEnsembleParameters::ByteSizeLong(TreeEnsembleParameters *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference value;
  long lVar4;
  size_t sVar5;
  uint64_t uVar6;
  int cached_size;
  size_t data_size;
  uint count;
  TreeEnsembleParameters_TreeNode *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  TreeEnsembleParameters *this_local;
  
  iVar2 = _internal_nodes_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = google::protobuf::
           RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::begin
                     (&this->nodes_);
  msg = (TreeEnsembleParameters_TreeNode *)
        google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::
        end(&this->nodes_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::TreeEnsembleParameters_TreeNode>::
                 operator!=(&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::TreeEnsembleParameters_TreeNode>::
            operator*(&__end2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::TreeEnsembleParameters_TreeNode>(value);
    sStack_18 = sVar5 + sStack_18;
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::TreeEnsembleParameters_TreeNode>::operator++
              (&__end2);
  }
  uVar3 = _internal_basepredictionvalue_size(this);
  lVar4 = (ulong)uVar3 * 8;
  if ((ulong)uVar3 != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar4);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  sStack_18 = lVar4 + sStack_18;
  uVar6 = _internal_numpredictiondimensions(this);
  if (uVar6 != 0) {
    uVar6 = _internal_numpredictiondimensions(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar6);
    sStack_18 = sVar5 + sStack_18;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar4 = std::__cxx11::string::size();
    sStack_18 = lVar4 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t TreeEnsembleParameters::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleParameters)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
  total_size += 1UL * this->_internal_nodes_size();
  for (const auto& msg : this->nodes_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated double basePredictionValue = 3;
  {
    unsigned int count = static_cast<unsigned int>(this->_internal_basepredictionvalue_size());
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    total_size += data_size;
  }

  // uint64 numPredictionDimensions = 2;
  if (this->_internal_numpredictiondimensions() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_numpredictiondimensions());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}